

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  UInt32 UVar2;
  long lVar3;
  int numBitLevels;
  uint uVar4;
  UInt32 (*paUVar5) [64];
  uint uVar6;
  UInt32 (*paUVar7) [128];
  long lVar8;
  ulong uVar9;
  long lVar10;
  CLzmaEnc *pCVar11;
  UInt32 tempPrices [128];
  
  for (lVar10 = 0; lVar10 != 0x7c; lVar10 = lVar10 + 1) {
    bVar1 = p->g_FastPos[lVar10 + 4];
    numBitLevels = (bVar1 >> 1) - 1;
    uVar6 = (bVar1 & 1 | 2) << ((byte)numBitLevels & 0x1f);
    UVar2 = RcTree_ReverseGetPrice
                      ((UInt16 *)((long)p + ((ulong)uVar6 * 2 - (ulong)((uint)bVar1 * 2)) + 0x341b2)
                       ,numBitLevels,((int)lVar10 - uVar6) + 4,p->ProbPrices);
    tempPrices[lVar10 + 4] = UVar2;
  }
  uVar6 = p->distTableSize;
  paUVar7 = p->distancesPrices;
  lVar8 = 0;
  paUVar5 = p->posSlotPrices;
  pCVar11 = p;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      UVar2 = RcTree_GetPrice(p->posSlotEncoder[lVar10],6,(UInt32)uVar9,p->ProbPrices);
      (*paUVar5)[uVar9] = UVar2;
    }
    uVar4 = 0x70;
    for (lVar3 = 0xcc13; lVar3 - 0xcc05U < (ulong)uVar6; lVar3 = lVar3 + 1) {
      pCVar11->reps[lVar3 + -0x13] = ((uVar4 & 0xfffffff0) + pCVar11->reps[lVar3 + -0x13]) - 0x50;
      uVar4 = uVar4 + 8;
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      (*paUVar7)[lVar3] = (*paUVar5)[lVar3];
    }
    for (lVar3 = 0; lVar3 != 0x7c; lVar3 = lVar3 + 1) {
      *(UInt32 *)((long)p->distancesPrices[0] + lVar3 * 4 + lVar8 + 0x10) =
           tempPrices[lVar3 + 4] + p->posSlotPrices[lVar10][p->g_FastPos[lVar3 + 4]];
    }
    paUVar5 = paUVar5 + 1;
    pCVar11 = (CLzmaEnc *)&pCVar11->matchFinderBase;
    paUVar7 = paUVar7 + 1;
    lVar8 = lVar8 + 0x200;
  }
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc *p)
{
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++)
  {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++)
  {
    UInt32 posSlot;
    const CLzmaProb *encoder = p->posSlotEncoder[lenToPosState];
    UInt32 *posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32 *distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}